

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

timer_ticks __thiscall timer::get_elapsed_us(timer *this)

{
  timer_ticks stop_time;
  timer_ticks local_18;
  
  if ((this->field_0x10 & 1) != 0) {
    local_18 = this->m_stop_time;
    if ((this->field_0x10 & 2) == 0) {
      query_counter(&local_18);
    }
    return ((g_freq >> 1) + (local_18 - this->m_start_time) * 1000000) / g_freq;
  }
  return 0;
}

Assistant:

timer_ticks timer::get_elapsed_us() const
{
   assert(m_started);
   if (!m_started)
      return 0;

   timer_ticks stop_time = m_stop_time;
   if (!m_stopped)
      query_counter(&stop_time);

   timer_ticks delta = stop_time - m_start_time;
   return (delta * 1000000ULL + (g_freq >> 1U)) / g_freq;
}